

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SolverTypes.h
# Opt level: O3

CRef __thiscall Minisat::ClauseAllocator::alloc(ClauseAllocator *this,Clause *from)

{
  Ref RVar1;
  uint uVar2;
  
  uVar2 = (uint)from->header >> 2 & 1 | (uint)this->extra_clause_field;
  RVar1 = RegionAllocator<unsigned_int>::alloc(&this->ra,((uint)from->header >> 5) + uVar2 + 1);
  if (RVar1 < (this->ra).sz) {
    Clause::Clause((Clause *)((this->ra).memory + RVar1),from,SUB41(uVar2,0));
    return RVar1;
  }
  __assert_fail("r < sz",
                "/workspace/llm4binary/github/license_all_cmakelists_25/luciferxiaozhi[P]VertexCover_CNFSAT_/minisat/minisat/mtl/Alloc.h"
                ,0x42,"T *Minisat::RegionAllocator<unsigned int>::lea(Ref) [T = unsigned int]");
}

Assistant:

CRef alloc(const Clause& from)
    {
        bool use_extra = from.learnt() | extra_clause_field;
        CRef cid       = ra.alloc(clauseWord32Size(from.size(), use_extra));
        new (lea(cid)) Clause(from, use_extra);
        return cid; }